

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O0

size_t __thiscall iffl::debug_memory_resource::get_busy_blocks_count(debug_memory_resource *this)

{
  debug_memory_resource *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->busy_blocks_count_).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

size_t get_busy_blocks_count() const noexcept {
        return busy_blocks_count_.load(std::memory_order_relaxed);
    }